

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Palette.h
# Opt level: O0

rgba_vec_t * __thiscall
sfc::Subpalette::normalized_colors(rgba_vec_t *__return_storage_ptr__,Subpalette *this)

{
  Subpalette *this_local;
  
  normalize_colors(__return_storage_ptr__,&this->_colors,this->_mode);
  return __return_storage_ptr__;
}

Assistant:

const rgba_vec_t normalized_colors() const { return normalize_colors(_colors, _mode); }